

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBox.h
# Opt level: O0

uint __thiscall Imath_2_5::Box<Imath_2_5::Vec3<int>_>::majorAxis(Box<Imath_2_5::Vec3<int>_> *this)

{
  int iVar1;
  int *piVar2;
  Vec3<int> s;
  uint major;
  Box<Imath_2_5::Vec3<int>_> *in_stack_ffffffffffffffe8;
  uint local_c;
  
  size(in_stack_ffffffffffffffe8);
  piVar2 = Vec3<int>::operator[]((Vec3<int> *)&stack0xffffffffffffffe8,1);
  iVar1 = *piVar2;
  piVar2 = Vec3<int>::operator[]((Vec3<int> *)&stack0xffffffffffffffe8,0);
  local_c = (uint)(*piVar2 < iVar1);
  piVar2 = Vec3<int>::operator[]((Vec3<int> *)&stack0xffffffffffffffe8,2);
  iVar1 = *piVar2;
  piVar2 = Vec3<int>::operator[]((Vec3<int> *)&stack0xffffffffffffffe8,local_c);
  if (*piVar2 < iVar1) {
    local_c = 2;
  }
  return local_c;
}

Assistant:

inline unsigned int
Box<Vec3<T> >::majorAxis() const
{
    unsigned int major = 0;
    Vec3<T>	 s     = size();

    if (s[1] > s[major])
        major = 1;

    if (s[2] > s[major])
        major = 2;

    return major;
}